

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowtest.cc
# Opt level: O3

Token __thiscall flowtest::Lexer::parseNumber(Lexer *this)

{
  pointer pcVar1;
  uint uVar2;
  ulong uVar3;
  
  this->numberValue_ = 0;
  uVar3 = (ulong)(this->currentPos_).offset;
  if ((this->source_)._M_string_length != uVar3) {
    do {
      pcVar1 = (this->source_)._M_dataplus._M_p;
      if (9 < (int)pcVar1[uVar3] - 0x30U) {
        return Number;
      }
      uVar2 = this->numberValue_ * 10;
      this->numberValue_ = uVar2;
      this->numberValue_ = ((int)pcVar1[uVar3] + uVar2) - 0x30;
      nextChar(this,1);
      uVar3 = (ulong)(this->currentPos_).offset;
    } while ((this->source_)._M_string_length != uVar3);
  }
  return Number;
}

Assistant:

Token Lexer::parseNumber() {
  numberValue_ = 0;

  while (std::isdigit(currentChar())) {
    numberValue_ *= 10;
    numberValue_ += currentChar() - '0';
    nextChar();
  }
  return Token::Number;
}